

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_sy_w16n_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [16];
  long lVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  auVar19 = _DAT_00515e10;
  do {
    if (0 < w) {
      lVar20 = 0;
      do {
        puVar1 = mask + lVar20;
        puVar2 = mask + lVar20 + (ulong)mask_stride;
        cVar21 = pavgb(*puVar2,*puVar1);
        cVar22 = pavgb(puVar2[1],puVar1[1]);
        cVar23 = pavgb(puVar2[2],puVar1[2]);
        cVar24 = pavgb(puVar2[3],puVar1[3]);
        cVar25 = pavgb(puVar2[4],puVar1[4]);
        cVar26 = pavgb(puVar2[5],puVar1[5]);
        cVar27 = pavgb(puVar2[6],puVar1[6]);
        cVar28 = pavgb(puVar2[7],puVar1[7]);
        cVar29 = pavgb(puVar2[8],puVar1[8]);
        cVar30 = pavgb(puVar2[9],puVar1[9]);
        cVar31 = pavgb(puVar2[10],puVar1[10]);
        cVar32 = pavgb(puVar2[0xb],puVar1[0xb]);
        cVar33 = pavgb(puVar2[0xc],puVar1[0xc]);
        cVar34 = pavgb(puVar2[0xd],puVar1[0xd]);
        cVar35 = pavgb(puVar2[0xe],puVar1[0xe]);
        cVar36 = pavgb(puVar2[0xf],puVar1[0xf]);
        auVar37 = *(undefined1 (*) [16])(src0 + lVar20);
        puVar1 = src1 + lVar20;
        auVar44._0_14_ = auVar37._0_14_;
        auVar44[0xe] = auVar37[7];
        auVar44[0xf] = puVar1[7];
        auVar43._14_2_ = auVar44._14_2_;
        auVar43._0_13_ = auVar37._0_13_;
        auVar43[0xd] = puVar1[6];
        auVar42._13_3_ = auVar43._13_3_;
        auVar42._0_12_ = auVar37._0_12_;
        auVar42[0xc] = auVar37[6];
        auVar41._12_4_ = auVar42._12_4_;
        auVar41._0_11_ = auVar37._0_11_;
        auVar41[0xb] = puVar1[5];
        auVar40._11_5_ = auVar41._11_5_;
        auVar40._0_10_ = auVar37._0_10_;
        auVar40[10] = auVar37[5];
        auVar45._10_6_ = auVar40._10_6_;
        auVar45._0_9_ = auVar37._0_9_;
        auVar45[9] = puVar1[4];
        auVar39._9_7_ = auVar45._9_7_;
        auVar39._0_8_ = auVar37._0_8_;
        auVar39[8] = auVar37[4];
        auVar38._8_8_ = auVar39._8_8_;
        auVar38[7] = puVar1[3];
        auVar38[6] = auVar37[3];
        auVar38[5] = puVar1[2];
        auVar38[4] = auVar37[2];
        auVar38[3] = puVar1[1];
        auVar38[2] = auVar37[1];
        auVar38[0] = auVar37[0];
        auVar38[1] = *puVar1;
        auVar47._8_8_ =
             (undefined8)
             (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11('@' - cVar28,cVar28),
                                                                    '@' - cVar27),cVar27),
                                                  '@' - cVar26),cVar26),'@' - cVar25),
                       CONCAT11(cVar25,cVar28)) >> 8);
        auVar47[7] = '@' - cVar24;
        auVar47[6] = cVar24;
        auVar47[5] = '@' - cVar23;
        auVar47[4] = cVar23;
        auVar47[3] = '@' - cVar22;
        auVar47[2] = cVar22;
        auVar47[1] = '@' - cVar21;
        auVar47[0] = cVar21;
        auVar45 = pmaddubsw(auVar38,auVar47);
        auVar46[1] = puVar1[8];
        auVar46[0] = auVar37[8];
        auVar46[2] = auVar37[9];
        auVar46[3] = puVar1[9];
        auVar46[4] = auVar37[10];
        auVar46[5] = puVar1[10];
        auVar46[6] = auVar37[0xb];
        auVar46[7] = puVar1[0xb];
        auVar46[8] = auVar37[0xc];
        auVar46[9] = puVar1[0xc];
        auVar46[10] = auVar37[0xd];
        auVar46[0xb] = puVar1[0xd];
        auVar46[0xc] = auVar37[0xe];
        auVar46[0xd] = puVar1[0xe];
        auVar46[0xe] = auVar37[0xf];
        auVar46[0xf] = puVar1[0xf];
        auVar37[1] = '@' - cVar29;
        auVar37[0] = cVar29;
        auVar37[2] = cVar30;
        auVar37[3] = '@' - cVar30;
        auVar37[4] = cVar31;
        auVar37[5] = '@' - cVar31;
        auVar37[6] = cVar32;
        auVar37[7] = '@' - cVar32;
        auVar37[8] = cVar33;
        auVar37[9] = '@' - cVar33;
        auVar37[10] = cVar34;
        auVar37[0xb] = '@' - cVar34;
        auVar37[0xc] = cVar35;
        auVar37[0xd] = '@' - cVar35;
        auVar37[0xe] = cVar36;
        auVar37[0xf] = '@' - cVar36;
        auVar37 = pmaddubsw(auVar46,auVar37);
        auVar46 = pmulhrsw(auVar45,auVar19);
        auVar37 = pmulhrsw(auVar37,auVar19);
        sVar3 = auVar46._0_2_;
        sVar4 = auVar46._2_2_;
        sVar5 = auVar46._4_2_;
        sVar6 = auVar46._6_2_;
        sVar7 = auVar46._8_2_;
        sVar8 = auVar46._10_2_;
        sVar9 = auVar46._12_2_;
        sVar10 = auVar46._14_2_;
        sVar11 = auVar37._0_2_;
        sVar12 = auVar37._2_2_;
        sVar13 = auVar37._4_2_;
        sVar14 = auVar37._6_2_;
        sVar15 = auVar37._8_2_;
        sVar16 = auVar37._10_2_;
        sVar17 = auVar37._12_2_;
        sVar18 = auVar37._14_2_;
        puVar1 = dst + lVar20;
        *puVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar46[0] - (0xff < sVar3);
        puVar1[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar46[2] - (0xff < sVar4);
        puVar1[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar46[4] - (0xff < sVar5);
        puVar1[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar46[6] - (0xff < sVar6);
        puVar1[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar46[8] - (0xff < sVar7);
        puVar1[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar46[10] - (0xff < sVar8);
        puVar1[6] = (0 < sVar9) * (sVar9 < 0x100) * auVar46[0xc] - (0xff < sVar9);
        puVar1[7] = (0 < sVar10) * (sVar10 < 0x100) * auVar46[0xe] - (0xff < sVar10);
        puVar1[8] = (0 < sVar11) * (sVar11 < 0x100) * auVar37[0] - (0xff < sVar11);
        puVar1[9] = (0 < sVar12) * (sVar12 < 0x100) * auVar37[2] - (0xff < sVar12);
        puVar1[10] = (0 < sVar13) * (sVar13 < 0x100) * auVar37[4] - (0xff < sVar13);
        puVar1[0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar37[6] - (0xff < sVar14);
        puVar1[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar37[8] - (0xff < sVar15);
        puVar1[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar37[10] - (0xff < sVar16);
        puVar1[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar37[0xc] - (0xff < sVar17);
        puVar1[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar37[0xe] - (0xff < sVar18);
        lVar20 = lVar20 + 0x10;
      } while (lVar20 < w);
    }
    dst = dst + dst_stride;
    src0 = src0 + src0_stride;
    src1 = src1 + src1_stride;
    mask = mask + mask_stride * 2;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_sy_w16n_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    int c;
    for (c = 0; c < w; c += 16) {
      const __m128i v_ra_b = xx_loadu_128(mask + c);
      const __m128i v_rb_b = xx_loadu_128(mask + c + mask_stride);
      const __m128i v_m0_b = _mm_avg_epu8(v_ra_b, v_rb_b);
      const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

      const __m128i v_res_b =
          blend_16_u8(src0 + c, src1 + c, &v_m0_b, &v_m1_b, &_r);

      xx_storeu_128(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}